

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void groupConcatInverse(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3_value *psVar1;
  uint uVar5;
  int iVar2;
  int iVar3;
  void *pvVar4;
  
  psVar1 = *argv;
  uVar5._0_2_ = psVar1->flags;
  uVar5._2_1_ = psVar1->enc;
  uVar5._3_1_ = psVar1->eSubtype;
  if (((0xaaaaaaaaU >> (uVar5 & 0x1f) & 1) == 0) &&
     (pvVar4 = sqlite3_aggregate_context(context,0x20), pvVar4 != (void *)0x0)) {
    iVar2 = sqlite3_value_bytes(*argv);
    if (argc == 2) {
      iVar3 = sqlite3_value_bytes(argv[1]);
    }
    else {
      iVar3 = 1;
    }
    iVar3 = iVar3 + iVar2;
    uVar5 = *(int *)((long)pvVar4 + 0x18) - iVar3;
    if (uVar5 == 0 || *(int *)((long)pvVar4 + 0x18) < iVar3) {
      *(undefined4 *)((long)pvVar4 + 0x18) = 0;
    }
    else {
      *(uint *)((long)pvVar4 + 0x18) = uVar5;
      memmove(*(void **)((long)pvVar4 + 8),
              (void *)((long)iVar3 + (long)*(void **)((long)pvVar4 + 8)),(ulong)uVar5);
      if (*(int *)((long)pvVar4 + 0x18) != 0) {
        return;
      }
    }
    *(undefined4 *)((long)pvVar4 + 0x14) = 0;
  }
  return;
}

Assistant:

static void groupConcatInverse(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int n;
  StrAccum *pAccum;
  assert( argc==1 || argc==2 );
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  pAccum = (StrAccum*)sqlite3_aggregate_context(context, sizeof(*pAccum));
  /* pAccum is always non-NULL since groupConcatStep() will have always
  ** run frist to initialize it */
  if( ALWAYS(pAccum) ){
    n = sqlite3_value_bytes(argv[0]);
    if( argc==2 ){
      n += sqlite3_value_bytes(argv[1]);
    }else{
      n++;
    }
    if( n>=(int)pAccum->nChar ){
      pAccum->nChar = 0;
    }else{
      pAccum->nChar -= n;
      memmove(pAccum->zText, &pAccum->zText[n], pAccum->nChar);
    }
    if( pAccum->nChar==0 ) pAccum->mxAlloc = 0;
  }
}